

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<std::pair<QString,_QFileInfo>_>::remove
          (QList<std::pair<QString,_QFileInfo>_> *this,char *__filename)

{
  QList<std::pair<QString,_QFileInfo>_> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  pair<QString,_QFileInfo> *in_stack_00000018;
  QMovableArrayOps<std::pair<QString,_QFileInfo>_> *in_stack_00000020;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(&this->d);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(&this->d);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9e7c9);
    QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}